

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O1

void __thiscall lsim::SimComponent::set_user_value(SimComponent *this,uint32_t index,Value value)

{
  if ((ulong)index <
      (ulong)((long)(this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
    (this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
    super__Vector_impl_data._M_start[index] = value;
    Simulator::activate_independent_simulation_func(this->m_sim,this);
    return;
  }
  __assert_fail("index < m_pins.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_component.cpp"
                ,99,"void lsim::SimComponent::set_user_value(uint32_t, Value)");
}

Assistant:

void SimComponent::set_user_value(uint32_t index, Value value) {
	assert(index < m_pins.size());
	m_user_values[index] = value;
	m_sim->activate_independent_simulation_func(this);
}